

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> * __thiscall
math::wide_integer::uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::operator*=
          (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *this,
          uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *other)

{
  uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> other_as_self_copy;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> dStack_28;
  
  if (this == other) {
    detail::fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_>::
    fixed_dynamic_array((fixed_dynamic_array<unsigned_int,_4096U,_std::allocator<unsigned_int>_> *)
                        &dStack_28,&other->values);
    void_math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::
    eval_mul_unary<131072u>(math::wide_integer::uintwide_t<131072u,unsigned_int,std::
    allocator<void>,false>&,math::wide_integer::uintwide_t<131072u,unsigned_int,std::
    allocator<void>,false>const&,std::enable_if<((131072u)/std::numeric_limits<unsigned_int>::
    digits)>=math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::
    number_of_limbs_karatsuba_threshold,void>::type__
              (this,(uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *)&dStack_28,
               (enable_if_t<((131072U___std::numeric_limits<unsigned_int>::digits)_>__number_of_limbs_karatsuba_threshold_>
                *)0x0);
    util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
    ~dynamic_array(&dStack_28);
  }
  else {
    void_math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::
    eval_mul_unary<131072u>(math::wide_integer::uintwide_t<131072u,unsigned_int,std::
    allocator<void>,false>&,math::wide_integer::uintwide_t<131072u,unsigned_int,std::
    allocator<void>,false>const&,std::enable_if<((131072u)/std::numeric_limits<unsigned_int>::
    digits)>=math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::
    number_of_limbs_karatsuba_threshold,void>::type__
              (this,other,
               (enable_if_t<((131072U___std::numeric_limits<unsigned_int>::digits)_>__number_of_limbs_karatsuba_threshold_>
                *)0x0);
  }
  return this;
}

Assistant:

constexpr auto operator*=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t other_as_self_copy(other); // NOLINT(performance-unnecessary-copy-initialization)

        eval_mul_unary(*this, other_as_self_copy);
      }
      else
      {
        eval_mul_unary(*this, other);
      }

      return *this;
    }